

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Cpu.cpp
# Opt level: O1

void __thiscall Gb_Cpu::map_code(Gb_Cpu *this,gb_addr_t start,uint size,void *data)

{
  long lVar1;
  ulong uVar2;
  
  if (0x1fff < size) {
    uVar2 = (ulong)(size & 0xffffe000) - 0x2000;
    lVar1 = (ulong)((size >> 0xd) + (start >> 0xd)) * 8;
    do {
      lVar1 = lVar1 + -8;
      *(ulong *)((long)this->state->code_map + lVar1) = (uVar2 & 0xffffffff) + (long)data;
      uVar2 = uVar2 - 0x2000;
    } while (uVar2 != 0xffffffffffffe000);
  }
  return;
}

Assistant:

void Gb_Cpu::map_code( gb_addr_t start, unsigned size, void* data )
{
	// address range must begin and end on page boundaries
	require( start % page_size == 0 );
	require( size % page_size == 0 );
	
	unsigned first_page = start / page_size;
	for ( unsigned i = size / page_size; i--; )
		set_code_page( first_page + i, (uint8_t*) data + i * page_size );
}